

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O1

void __thiscall deci::dictionary_t::~dictionary_t(dictionary_t *this)

{
  ~dictionary_t(this);
  operator_delete(this);
  return;
}

Assistant:

dictionary_t::~dictionary_t() {
    for (auto el: this->storage) {
      el.first->Delete();
      el.second->Delete();
    }
  }